

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O1

void __thiscall
GlobOpt::KillAuxSlotPtrSyms
          (GlobOpt *this,PropertySymOpnd *opnd,BasicBlock *block,bool isObjTypeSpecialized)

{
  code *pcVar1;
  BOOLEAN BVar2;
  bool bVar3;
  PropertySym *this_00;
  StackSym *pSVar4;
  undefined4 *puVar5;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,isObjTypeSpecialized) != 0) {
    this_00 = IR::PropertySymOpnd::GetPropertySym(opnd);
    pSVar4 = PropertySym::GetAuxSlotPtrSym(this_00);
    if (pSVar4 != (StackSym *)0x0) {
      if (this->auxSlotPtrSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
LAB_004a2dae:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                           ,0x3c9,
                           "(this->auxSlotPtrSyms && this->auxSlotPtrSyms->Test(auxSlotPtrSym->m_id))"
                           ,
                           "this->auxSlotPtrSyms && this->auxSlotPtrSyms->Test(auxSlotPtrSym->m_id)"
                          );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      else {
        BVar2 = BVSparse<Memory::JitArenaAllocator>::Test
                          (this->auxSlotPtrSyms,(pSVar4->super_Sym).m_id);
        if (BVar2 == '\0') goto LAB_004a2dae;
      }
      BVSparse<Memory::JitArenaAllocator>::Clear(this->auxSlotPtrSyms,(pSVar4->super_Sym).m_id);
      goto LAB_004a2e15;
    }
  }
  pSVar4 = (StackSym *)0x0;
LAB_004a2e15:
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Minus>
            ((block->globOptData).liveFields,this->auxSlotPtrSyms);
  if (pSVar4 != (StackSym *)0x0) {
    BVSparse<Memory::JitArenaAllocator>::Set(this->auxSlotPtrSyms,(pSVar4->super_Sym).m_id);
    return;
  }
  return;
}

Assistant:

void
GlobOpt::KillAuxSlotPtrSyms(IR::PropertySymOpnd *opnd, BasicBlock *block, bool isObjTypeSpecialized)
{
    StackSym *auxSlotPtrSym = nullptr;
    if (isObjTypeSpecialized)
    {
        // Kill all aux slot syms other than this one
        auxSlotPtrSym = opnd->GetAuxSlotPtrSym();
        if (auxSlotPtrSym)
        {
            Assert(this->auxSlotPtrSyms && this->auxSlotPtrSyms->Test(auxSlotPtrSym->m_id));
            this->auxSlotPtrSyms->Clear(auxSlotPtrSym->m_id);
        }
    }

    block->globOptData.liveFields->Minus(this->auxSlotPtrSyms);

    if (auxSlotPtrSym)
    {
        this->auxSlotPtrSyms->Set(auxSlotPtrSym->m_id);
    }
}